

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall
higan::Timer::Timer(Timer *this,string *name,int timeout,bool repeat,TimerCallback *callback)

{
  int64_t time;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  time = TimeStamp::Now();
  TimeStamp::TimeStamp(&this->expire_time_,time);
  this->timeout_ = timeout;
  this->repeat_ = repeat;
  std::function<void_(const_higan::Timer_&)>::function(&this->timer_callback_,callback);
  TimeStamp::AddMillisecond(&this->expire_time_,timeout);
  return;
}

Assistant:

Timer::Timer(const std::string& name, int timeout, bool repeat, const TimerCallback& callback):
		name_(name),
		expire_time_(TimeStamp::Now()),
		timeout_(timeout),
		repeat_(repeat),
		timer_callback_(callback)
{
	expire_time_.AddMillisecond(timeout);
}